

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_model.c
# Opt level: O2

fsg_arciter_t * fsg_arciter_next(fsg_arciter_t *itor)

{
  gnode_s *pgVar1;
  hash_iter_t *phVar2;
  
  if (itor->gn == (gnode_t *)0x0) {
    if (itor->null_itor == (hash_iter_t *)0x0) goto LAB_0012b51a;
    phVar2 = hash_table_iter_next(itor->null_itor);
    itor->null_itor = phVar2;
  }
  else {
    pgVar1 = itor->gn->next;
    itor->gn = pgVar1;
    if (pgVar1 != (gnode_s *)0x0) {
      return itor;
    }
    phVar2 = hash_table_iter_next(itor->itor);
    itor->itor = phVar2;
    if (phVar2 != (hash_iter_t *)0x0) {
      itor->gn = (gnode_t *)phVar2->ent->val;
      return itor;
    }
    phVar2 = itor->null_itor;
  }
  if (phVar2 != (hash_iter_t *)0x0) {
    return itor;
  }
LAB_0012b51a:
  fsg_arciter_free(itor);
  return (fsg_arciter_t *)0x0;
}

Assistant:

fsg_arciter_t *
fsg_arciter_next(fsg_arciter_t * itor)
{
    /* Iterate over non-null arcs first. */
    if (itor->gn) {
        itor->gn = gnode_next(itor->gn);
        /* Move to the next destination arc. */
        if (itor->gn == NULL) {
            itor->itor = hash_table_iter_next(itor->itor);
            if (itor->itor != NULL)
                itor->gn = hash_entry_val(itor->itor->ent);
            else if (itor->null_itor == NULL)
                goto stop_iteration;
        }
    }
    else {
        if (itor->null_itor == NULL)
            goto stop_iteration;
        itor->null_itor = hash_table_iter_next(itor->null_itor);
        if (itor->null_itor == NULL)
            goto stop_iteration;
    }
    return itor;
  stop_iteration:
    fsg_arciter_free(itor);
    return NULL;

}